

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O3

bool xmrig::Json::getBool(Value *obj,char *key,bool defaultValue)

{
  undefined1 uVar1;
  undefined8 local_20;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffe0,(Ch *)obj);
  uVar1 = defaultValue;
  if ((local_20 !=
       (ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff)) &&
     (uVar1 = *(ushort *)(local_20 + 0x1e) == 10, (*(ushort *)(local_20 + 0x1e) & 8) == 0)) {
    uVar1 = defaultValue;
  }
  return (bool)uVar1;
}

Assistant:

bool xmrig::Json::getBool(const rapidjson::Value &obj, const char *key, bool defaultValue)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsBool()) {
        return i->value.GetBool();
    }

    return defaultValue;
}